

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

QHash<int,_QByteArray> __thiscall
QConcatenateTablesProxyModel::roleNames(QConcatenateTablesProxyModel *this)

{
  bool bVar1;
  QConcatenateTablesProxyModelPrivate *pQVar2;
  const_iterator o;
  ModelInfo *pMVar3;
  Data *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemModel **model;
  QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *__range2;
  QConcatenateTablesProxyModelPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  QHash<QByteArray,_QTzTimeZone> *in_stack_ffffffffffffff78;
  QHash<int,_QByteArray> *in_stack_ffffffffffffff80;
  QHash<int,_QByteArray> *in_stack_ffffffffffffff88;
  Data *this_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QConcatenateTablesProxyModel *)0x85aa1d);
  if ((*(uint *)&pQVar2->field_0x104 & 1) != 0) {
    QAbstractItemModelPrivate::defaultRoleNames();
    QHash<int,_QByteArray>::operator=((QHash<int,_QByteArray> *)in_RDI,in_stack_ffffffffffffff88);
    local_10.i = (ModelInfo *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::begin
                         ((QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *)
                          in_stack_ffffffffffffff80);
    o = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::end
                  ((QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *)
                   in_stack_ffffffffffffff80);
    while( true ) {
      bVar1 = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::const_iterator::operator!=
                        (&local_10,o);
      if (!bVar1) break;
      pMVar3 = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::const_iterator::operator*
                         (&local_10);
      in_stack_ffffffffffffff80 = &pQVar2->m_roleNames;
      (*(pMVar3->model->super_QObject)._vptr_QObject[0x2c])();
      QHash<int,_QByteArray>::insert
                ((QHash<int,_QByteArray> *)this_00,(QHash<int,_QByteArray> *)in_RDI);
      QHash<int,_QByteArray>::~QHash((QHash<QByteArray,_QTzTimeZone> *)in_stack_ffffffffffffff80);
      QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::const_iterator::operator++(&local_10);
    }
    *(uint *)&pQVar2->field_0x104 = *(uint *)&pQVar2->field_0x104 & 0xfffffffe;
  }
  QHash<int,_QByteArray>::QHash
            ((QHash<QByteArray,_QTzTimeZone> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QHash<int,_QByteArray>)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QHash<int, QByteArray> QConcatenateTablesProxyModel::roleNames() const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_roleNamesDirty) {
        d->m_roleNames = QAbstractItemModelPrivate::defaultRoleNames();
        for (const auto &[model, _] : d->m_models)
            d->m_roleNames.insert(model->roleNames());
        d->m_roleNamesDirty = false;
    }
    return d->m_roleNames;
}